

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

void CollectColorRedTransforms_SSE2
               (uint32_t *argb,int stride,int tile_width,int tile_height,int green_to_red,int *histo
               )

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint tile_width_00;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 local_38 [16];
  uint16_t values [8];
  
  auVar4 = _DAT_00147910;
  auVar3 = _DAT_00142b50;
  iVar5 = ((int)(char)green_to_red & 0x1fffU) * 8;
  auVar10._4_4_ = iVar5;
  auVar10._0_4_ = iVar5;
  auVar10._8_4_ = iVar5;
  auVar10._12_4_ = iVar5;
  uVar7 = 0;
  uVar6 = 0;
  if (0 < tile_height) {
    uVar6 = (ulong)(uint)tile_height;
  }
  for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    lVar8 = 0;
    while (lVar1 = lVar8 + 8, lVar1 <= tile_width) {
      auVar12 = *(undefined1 (*) [16])(argb + uVar7 * (long)stride + lVar8);
      auVar2 = *(undefined1 (*) [16])(argb + uVar7 * (long)stride + lVar8 + 4);
      auVar11 = pmulhw(auVar12 & auVar4,auVar10);
      auVar13[0] = auVar12[2] - auVar11[0];
      auVar13[1] = auVar12[3] - auVar11[1];
      auVar13[2] = -auVar11[2];
      auVar13[3] = -auVar11[3];
      auVar13[4] = auVar12[6] - auVar11[4];
      auVar13[5] = auVar12[7] - auVar11[5];
      auVar13[6] = -auVar11[6];
      auVar13[7] = -auVar11[7];
      auVar13[8] = auVar12[10] - auVar11[8];
      auVar13[9] = auVar12[0xb] - auVar11[9];
      auVar13[10] = -auVar11[10];
      auVar13[0xb] = -auVar11[0xb];
      auVar13[0xc] = auVar12[0xe] - auVar11[0xc];
      auVar13[0xd] = auVar12[0xf] - auVar11[0xd];
      auVar13[0xe] = -auVar11[0xe];
      auVar13[0xf] = -auVar11[0xf];
      auVar12 = pmulhw(auVar2 & auVar4,auVar10);
      auVar11[0] = auVar2[2] - auVar12[0];
      auVar11[1] = auVar2[3] - auVar12[1];
      auVar11[2] = -auVar12[2];
      auVar11[3] = -auVar12[3];
      auVar11[4] = auVar2[6] - auVar12[4];
      auVar11[5] = auVar2[7] - auVar12[5];
      auVar11[6] = -auVar12[6];
      auVar11[7] = -auVar12[7];
      auVar11[8] = auVar2[10] - auVar12[8];
      auVar11[9] = auVar2[0xb] - auVar12[9];
      auVar11[10] = -auVar12[10];
      auVar11[0xb] = -auVar12[0xb];
      auVar11[0xc] = auVar2[0xe] - auVar12[0xc];
      auVar11[0xd] = auVar2[0xf] - auVar12[0xd];
      auVar11[0xe] = -auVar12[0xe];
      auVar11[0xf] = -auVar12[0xf];
      local_38 = packssdw(auVar13 & auVar3,auVar11 & auVar3);
      for (lVar9 = 0; lVar8 = lVar1, lVar9 != 8; lVar9 = lVar9 + 1) {
        histo[*(ushort *)(local_38 + lVar9 * 2)] = histo[*(ushort *)(local_38 + lVar9 * 2)] + 1;
      }
    }
  }
  tile_width_00 = tile_width & 7;
  if (tile_width_00 == 0) {
    return;
  }
  VP8LCollectColorRedTransforms_C
            ((uint32_t *)((long)argb + ((long)tile_width * 4 - (ulong)(tile_width_00 * 4))),stride,
             tile_width_00,tile_height,green_to_red,histo);
  return;
}

Assistant:

static void CollectColorRedTransforms_SSE2(const uint32_t* argb, int stride,
                                           int tile_width, int tile_height,
                                           int green_to_red, int histo[]) {
  const __m128i mults_g = MK_CST_16(0, CST_5b(green_to_red));
  const __m128i mask_g = _mm_set1_epi32(0x00ff00);  // green mask
  const __m128i mask = _mm_set1_epi32(0xff);

  int y;
  for (y = 0; y < tile_height; ++y) {
    const uint32_t* const src = argb + y * stride;
    int i, x;
    for (x = 0; x + SPAN <= tile_width; x += SPAN) {
      uint16_t values[SPAN];
      const __m128i in0 = _mm_loadu_si128((__m128i*)&src[x +        0]);
      const __m128i in1 = _mm_loadu_si128((__m128i*)&src[x + SPAN / 2]);
      const __m128i A0 = _mm_and_si128(in0, mask_g);    // 0 0  | g 0
      const __m128i A1 = _mm_and_si128(in1, mask_g);
      const __m128i B0 = _mm_srli_epi32(in0, 16);       // 0 0  | x r
      const __m128i B1 = _mm_srli_epi32(in1, 16);
      const __m128i C0 = _mm_mulhi_epi16(A0, mults_g);  // 0 0  | x dr
      const __m128i C1 = _mm_mulhi_epi16(A1, mults_g);
      const __m128i E0 = _mm_sub_epi8(B0, C0);          // x x  | x r'
      const __m128i E1 = _mm_sub_epi8(B1, C1);
      const __m128i F0 = _mm_and_si128(E0, mask);       // 0 0  | 0 r'
      const __m128i F1 = _mm_and_si128(E1, mask);
      const __m128i I = _mm_packs_epi32(F0, F1);
      _mm_storeu_si128((__m128i*)values, I);
      for (i = 0; i < SPAN; ++i) ++histo[values[i]];
    }
  }
  {
    const int left_over = tile_width & (SPAN - 1);
    if (left_over > 0) {
      VP8LCollectColorRedTransforms_C(argb + tile_width - left_over, stride,
                                      left_over, tile_height,
                                      green_to_red, histo);
    }
  }
}